

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIHexDecoder::decode(FIHexDecoder *this,uint8_t *data,size_t len)

{
  undefined8 uVar1;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar2;
  allocator_type local_39;
  undefined1 local_38 [16];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,(uchar *)len,
             (uchar *)(in_RCX + len),&local_39);
  FIHexValue::create((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  uVar1 = local_38._8_8_;
  local_38._8_8_ = (pointer)0x0;
  *this = (FIHexDecoder)local_38._0_8_;
  this[1] = (FIHexDecoder)uVar1;
  local_38._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIHexValue::create(std::vector<uint8_t>(data, data + len));
    }